

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayFirstTests::init
          (SingleVertexArrayFirstTests *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  InputType type;
  int t;
  GLValue max_;
  TestNode *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  MultiVertexArrayTest *this_01;
  ulong *puVar7;
  InputType type_00;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  bool bVar11;
  GLValue GVar12;
  string name;
  Spec spec;
  ArraySpec arraySpec;
  long local_288;
  long *local_280;
  undefined8 local_278;
  long local_270;
  undefined8 uStack_268;
  long *local_260;
  undefined8 local_258;
  long local_250;
  undefined8 uStack_248;
  long local_240;
  long local_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  long *local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  undefined8 uStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  undefined1 local_f0 [16];
  pointer local_e0;
  pointer pAStack_d8;
  pointer local_d0;
  long local_c8;
  TestNode *local_c0;
  long local_b8;
  string local_b0;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  lVar10 = 0;
  local_c0 = (TestNode *)this;
  do {
    local_288 = 0;
    local_c8 = lVar10;
    do {
      local_240 = 0;
      do {
        local_b8 = 0;
        do {
          local_238 = 0;
          do {
            if (local_b8 == 0) {
              iVar2 = deqp::gls::Array::inputTypeSize((&DAT_01c32570)[lVar10]);
              iVar2 = iVar2 * 2;
            }
            else {
              iVar2 = (&DAT_01c3257c)[local_b8];
            }
            type = (&DAT_01c32570)[lVar10];
            iVar3 = deqp::gls::Array::inputTypeSize(type);
            if (iVar2 % iVar3 == 0) {
              iVar3 = *(int *)(&DAT_01c32588 + local_288 * 4);
              iVar4 = deqp::gls::Array::inputTypeSize(type);
              bVar11 = iVar3 % iVar4 == 0;
            }
            else {
              bVar11 = false;
            }
            iVar3 = *(int *)(&DAT_01c32588 + local_288 * 4);
            GVar12 = deqp::gls::GLValue::getMinValue(type);
            aStack_78 = GVar12.field_1;
            local_80 = GVar12.type;
            GVar12 = deqp::gls::GLValue::getMaxValue(type);
            aStack_88 = GVar12.field_1;
            local_90 = GVar12.type;
            max_._4_4_ = uStack_8c;
            max_.type = local_90;
            GVar12._4_4_ = uStack_7c;
            GVar12.type = local_80;
            GVar12.field_1 = aStack_78;
            max_.field_1 = aStack_88;
            deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                      (&local_70,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,2,iVar3,
                       iVar2,false,GVar12,max_);
            local_e0 = (pointer)0x0;
            pAStack_d8 = (pointer)0x0;
            local_d0 = (pointer)0x0;
            local_f0._0_4_ = PRIMITIVE_TRIANGLES;
            iVar4 = *(int *)(&DAT_01c0f860 + local_240 * 4);
            t = *(int *)((long)&DAT_01c0f868 + local_238);
            local_f0._4_4_ = iVar4;
            local_f0._8_4_ = t;
            std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
            ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                      ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                        *)&local_e0,(iterator)0x0,&local_70);
            deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_b0,(Array *)(ulong)type,type_00);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_230 = &local_220;
            puVar7 = (ulong *)(plVar5 + 2);
            if ((ulong *)*plVar5 == puVar7) {
              local_220 = *puVar7;
              lStack_218 = plVar5[3];
            }
            else {
              local_220 = *puVar7;
              local_230 = (ulong *)*plVar5;
            }
            local_228 = plVar5[1];
            *plVar5 = (long)puVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            typeToString<int>(&local_110,t);
            uVar8 = 0xf;
            if (local_230 != &local_220) {
              uVar8 = local_220;
            }
            if (uVar8 < local_110._M_string_length + local_228) {
              uVar9 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                uVar9 = local_110.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar9 < local_110._M_string_length + local_228) goto LAB_0107336d;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_110,0,(char *)0x0,(ulong)local_230);
            }
            else {
LAB_0107336d:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_230,(ulong)local_110._M_dataplus._M_p);
            }
            local_260 = &local_250;
            plVar5 = puVar6 + 2;
            if ((long *)*puVar6 == plVar5) {
              local_250 = *plVar5;
              uStack_248 = puVar6[3];
            }
            else {
              local_250 = *plVar5;
              local_260 = (long *)*puVar6;
            }
            local_258 = puVar6[1];
            *puVar6 = plVar5;
            puVar6[1] = 0;
            *(undefined1 *)plVar5 = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
            local_210 = &local_200;
            puVar7 = (ulong *)(plVar5 + 2);
            if ((ulong *)*plVar5 == puVar7) {
              local_200 = *puVar7;
              lStack_1f8 = plVar5[3];
            }
            else {
              local_200 = *puVar7;
              local_210 = (ulong *)*plVar5;
            }
            local_208 = plVar5[1];
            *plVar5 = (long)puVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            typeToString<int>(&local_130,iVar3);
            uVar8 = 0xf;
            if (local_210 != &local_200) {
              uVar8 = local_200;
            }
            if (uVar8 < local_130._M_string_length + local_208) {
              uVar9 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                uVar9 = local_130.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar9 < local_130._M_string_length + local_208) goto LAB_010734b2;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_130,0,(char *)0x0,(ulong)local_210);
            }
            else {
LAB_010734b2:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_210,(ulong)local_130._M_dataplus._M_p);
            }
            local_280 = &local_270;
            plVar5 = puVar6 + 2;
            if ((long *)*puVar6 == plVar5) {
              local_270 = *plVar5;
              uStack_268 = puVar6[3];
            }
            else {
              local_270 = *plVar5;
              local_280 = (long *)*puVar6;
            }
            local_278 = puVar6[1];
            *puVar6 = plVar5;
            puVar6[1] = 0;
            *(undefined1 *)plVar5 = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_280);
            local_1d0 = &local_1c0;
            puVar7 = (ulong *)(plVar5 + 2);
            if ((ulong *)*plVar5 == puVar7) {
              local_1c0 = *puVar7;
              lStack_1b8 = plVar5[3];
            }
            else {
              local_1c0 = *puVar7;
              local_1d0 = (ulong *)*plVar5;
            }
            local_1c8 = plVar5[1];
            *plVar5 = (long)puVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            typeToString<int>(&local_150,iVar2);
            uVar8 = 0xf;
            if (local_1d0 != &local_1c0) {
              uVar8 = local_1c0;
            }
            if (uVar8 < local_150._M_string_length + local_1c8) {
              uVar9 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                uVar9 = local_150.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar9 < local_150._M_string_length + local_1c8) goto LAB_01073604;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_150,0,(char *)0x0,(ulong)local_1d0);
            }
            else {
LAB_01073604:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1d0,(ulong)local_150._M_dataplus._M_p);
            }
            plVar5 = puVar6 + 2;
            if ((long *)*puVar6 == plVar5) {
              local_180 = *plVar5;
              uStack_178 = puVar6[3];
              local_190 = &local_180;
            }
            else {
              local_180 = *plVar5;
              local_190 = (long *)*puVar6;
            }
            local_188 = puVar6[1];
            *puVar6 = plVar5;
            puVar6[1] = 0;
            *(undefined1 *)plVar5 = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_1b0 = &local_1a0;
            puVar7 = (ulong *)(plVar5 + 2);
            if ((ulong *)*plVar5 == puVar7) {
              local_1a0 = *puVar7;
              lStack_198 = plVar5[3];
            }
            else {
              local_1a0 = *puVar7;
              local_1b0 = (ulong *)*plVar5;
            }
            local_1a8 = plVar5[1];
            *plVar5 = (long)puVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            typeToString<int>(&local_170,iVar4);
            uVar8 = 0xf;
            if (local_1b0 != &local_1a0) {
              uVar8 = local_1a0;
            }
            if (uVar8 < local_170._M_string_length + local_1a8) {
              uVar9 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                uVar9 = local_170.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar9 < local_170._M_string_length + local_1a8) goto LAB_01073754;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_170,0,(char *)0x0,(ulong)local_1b0);
            }
            else {
LAB_01073754:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1b0,(ulong)local_170._M_dataplus._M_p);
            }
            local_1f0 = &local_1e0;
            plVar5 = puVar6 + 2;
            if ((long *)*puVar6 == plVar5) {
              local_1e0 = *plVar5;
              uStack_1d8 = puVar6[3];
            }
            else {
              local_1e0 = *plVar5;
              local_1f0 = (long *)*puVar6;
            }
            local_1e8 = puVar6[1];
            *puVar6 = plVar5;
            puVar6[1] = 0;
            *(undefined1 *)plVar5 = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1b0 != &local_1a0) {
              operator_delete(local_1b0,local_1a0 + 1);
            }
            if (local_190 != &local_180) {
              operator_delete(local_190,local_180 + 1);
            }
            this_00 = local_c0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0,local_1c0 + 1);
            }
            if (local_280 != &local_270) {
              operator_delete(local_280,local_270 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_210 != &local_200) {
              operator_delete(local_210,local_200 + 1);
            }
            if (local_260 != &local_250) {
              operator_delete(local_260,local_250 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_230 != &local_220) {
              operator_delete(local_230,local_220 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if (!bVar11) {
              this_01 = (MultiVertexArrayTest *)operator_new(0xe0);
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_01,this_00->m_testCtx,(RenderContext *)this_00[1]._vptr_TestNode[1],
                         (Spec *)local_f0,(char *)local_1f0,(char *)local_1f0);
              tcu::TestNode::addChild(this_00,(TestNode *)this_01);
            }
            if (local_1f0 != &local_1e0) {
              operator_delete(local_1f0,local_1e0 + 1);
            }
            lVar10 = local_c8;
            if (local_e0 != (pointer)0x0) {
              operator_delete(local_e0,(long)local_d0 - (long)local_e0);
            }
            local_238 = local_238 + 4;
          } while (local_238 == 4);
          local_b8 = local_b8 + 1;
        } while (local_b8 != 3);
        bVar11 = local_240 == 0;
        local_240 = local_240 + 1;
      } while (bVar11);
      lVar1 = local_288 + 1;
      bVar11 = local_288 == 0;
      local_288 = lVar1;
    } while (bVar11);
    lVar10 = lVar10 + 1;
    if (lVar10 == 3) {
      return (int)lVar1;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayFirstTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_FIXED};
	int					counts[]		= {5, 256};
	int					firsts[]		= {6, 24};
	int					offsets[]		= {1, 17};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); firstNdx++)
					{
						const int	stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
						const bool	aligned	= ((stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0) && (offsets[offsetNdx] % Array::inputTypeSize(inputTypes[inputTypeNdx]) == 0);

						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		Array::OUTPUTTYPE_VEC2,
																		Array::STORAGE_BUFFER,
																		Array::USAGE_DYNAMIC_DRAW,
																		2,
																		offsets[offsetNdx],
																		stride,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= firsts[firstNdx];
						spec.arrays.push_back(arraySpec);

						std::string name = Array::inputTypeToString(inputTypes[inputTypeNdx]) + "_first" + typeToString(firsts[firstNdx]) + "_offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);
						if (!aligned)
							addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}